

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcpclient.cpp
# Opt level: O1

void uv::TCPClient::AfterSend(uv_write_t *req,int status)

{
  size_t *psVar1;
  undefined8 *puVar2;
  TCPClient *this;
  long lVar3;
  FILE *__stream;
  uint uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  _List_node_base *p_Var8;
  ILog4zManager *pIVar9;
  long lVar10;
  int iVar11;
  char *pcVar12;
  long *in_FS_OFFSET;
  string local_70;
  string local_50;
  
  this = (TCPClient *)req->data;
  if (-1 < status) {
    send_inl(this,req);
    return;
  }
  if ((this->writeparam_list_).
      super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl._M_node.
      _M_size < 0x15) {
    p_Var8 = (_List_node_base *)operator_new(0x18);
    p_Var8[1]._M_next = (_List_node_base *)req;
    std::__detail::_List_node_base::_M_hook(p_Var8);
    psVar1 = &(this->writeparam_list_).
              super__List_base<uv::_write_param_*,_std::allocator<uv::_write_param_*>_>._M_impl.
              _M_node._M_size;
    *psVar1 = *psVar1 + 1;
  }
  else {
    free(req[1].data);
    free(req);
  }
  lVar3 = *in_FS_OFFSET;
  puVar2 = (undefined8 *)(lVar3 + -0x800);
  *puVar2 = 0x72726520646e6573;
  *(undefined4 *)(lVar3 + -0x7f8) = 0x3a726f;
  pcVar12 = (char *)(lVar3 + -0x7f5);
  GetUVError_abi_cxx11_(&local_50,status);
  uVar5 = snprintf(pcVar12,0x7f5,"%s",local_50._M_dataplus._M_p);
  uVar4 = 0;
  if ((int)uVar5 < 0) {
LAB_0011c6c4:
    uVar5 = uVar4;
    *pcVar12 = '\0';
  }
  else if (0x7f4 < (int)uVar5) {
    pcVar12 = (char *)(lVar3 + -1);
    uVar4 = 0x7f5;
    goto LAB_0011c6c4;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_50._M_dataplus._M_p != &local_50.field_2) {
    operator_delete(local_50._M_dataplus._M_p,local_50.field_2._M_allocated_capacity + 1);
  }
  lVar10 = (ulong)uVar5 + 0xb;
  if (uVar5 < 0x7f5) {
    pcVar12 = (char *)((long)puVar2 + (ulong)uVar5 + 0xb);
    iVar11 = 0x800 - (int)lVar10;
    iVar6 = snprintf(pcVar12,(long)iVar11,"%s"," ( ");
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_0011c735:
      *pcVar12 = '\0';
    }
    else {
      iVar7 = iVar6;
      if (iVar11 <= iVar6) {
        pcVar12 = (char *)(lVar3 + -1);
        iVar7 = iVar11;
        goto LAB_0011c735;
      }
    }
    lVar10 = lVar10 + iVar7;
  }
  if (lVar10 < 0x800) {
    pcVar12 = (char *)((long)puVar2 + lVar10);
    iVar11 = 0x800 - (int)lVar10;
    iVar6 = snprintf(pcVar12,(long)iVar11,"%s"," ");
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_0011c786:
      *pcVar12 = '\0';
    }
    else {
      iVar7 = iVar6;
      if (iVar11 <= iVar6) {
        pcVar12 = (char *)(lVar3 + -1);
        iVar7 = iVar11;
        goto LAB_0011c786;
      }
    }
    lVar10 = lVar10 + iVar7;
  }
  if (lVar10 < 0x800) {
    pcVar12 = (char *)((long)puVar2 + lVar10);
    iVar11 = 0x800 - (int)lVar10;
    iVar6 = snprintf(pcVar12,(long)iVar11,"%s"," ) : ");
    iVar7 = 0;
    if (iVar6 < 0) {
LAB_0011c7d7:
      *pcVar12 = '\0';
    }
    else {
      iVar7 = iVar6;
      if (iVar11 <= iVar6) {
        pcVar12 = (char *)(lVar3 + -1);
        iVar7 = iVar11;
        goto LAB_0011c7d7;
      }
    }
    lVar10 = lVar10 + iVar7;
  }
  if (lVar10 < 0x800) {
    pcVar12 = (char *)((long)puVar2 + lVar10);
    iVar6 = 0x800 - (int)lVar10;
    iVar7 = snprintf(pcVar12,(long)iVar6,"%d",0x187);
    if (-1 < iVar7) {
      if (iVar7 < iVar6) goto LAB_0011c828;
      pcVar12 = (char *)(lVar3 + -1);
    }
    *pcVar12 = '\0';
  }
LAB_0011c828:
  pIVar9 = zsummer::log4z::ILog4zManager::GetInstance();
  (*pIVar9->_vptr_ILog4zManager[8])(pIVar9,0,3,puVar2);
  __stream = _stderr;
  GetUVError_abi_cxx11_(&local_70,status);
  fprintf(__stream,"send error %s\n",local_70._M_dataplus._M_p);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_70._M_dataplus._M_p != &local_70.field_2) {
    operator_delete(local_70._M_dataplus._M_p,local_70.field_2._M_allocated_capacity + 1);
  }
  return;
}

Assistant:

void TCPClient::AfterSend(uv_write_t* req, int status)
{
    TCPClient* theclass = (TCPClient*)req->data;
    if (status < 0) {
        if (theclass->writeparam_list_.size() > MAXLISTSIZE) {
            FreeWriteParam((write_param*)req);
        } else {
            theclass->writeparam_list_.push_back((write_param*)req);
        }
        LOGE("send error:" << GetUVError(status));
        fprintf(stderr, "send error %s\n", GetUVError(status).c_str());
        return;
    }
    theclass->send_inl(req);
}